

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qslider.cpp
# Opt level: O3

QSize __thiscall QSlider::minimumSizeHint(QSlider *this)

{
  undefined8 uVar1;
  long lVar2;
  uint uVar3;
  ulong uVar4;
  QStyle *pQVar5;
  long lVar6;
  ulong uVar7;
  undefined8 *puVar8;
  QStyleOptionSlider *pQVar9;
  ulong uVar10;
  long in_FS_OFFSET;
  byte bVar11;
  QStyleOptionSlider opt;
  QStyleOptionSlider local_b0;
  long local_30;
  
  bVar11 = 0;
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QAbstractSlider).super_QWidget.field_0x8;
  uVar4 = (**(code **)(*(long *)&(this->super_QAbstractSlider).super_QWidget + 0x70))();
  uVar10 = uVar4 >> 0x20;
  puVar8 = &DAT_006dcd20;
  pQVar9 = &local_b0;
  for (lVar6 = 0x10; lVar6 != 0; lVar6 = lVar6 + -1) {
    uVar1 = *puVar8;
    (pQVar9->super_QStyleOptionComplex).super_QStyleOption.version = (int)uVar1;
    (pQVar9->super_QStyleOptionComplex).super_QStyleOption.type = (int)((ulong)uVar1 >> 0x20);
    puVar8 = puVar8 + (ulong)bVar11 * -2 + 1;
    pQVar9 = (QStyleOptionSlider *)((long)pQVar9 + (ulong)bVar11 * -0x10 + 8);
  }
  QStyleOptionSlider::QStyleOptionSlider(&local_b0);
  (**(code **)(*(long *)&(this->super_QAbstractSlider).super_QWidget + 0x1a8))(this,&local_b0);
  pQVar5 = QWidget::style((QWidget *)this);
  uVar3 = (**(code **)(*(long *)pQVar5 + 0xe0))(pQVar5,0xd,&local_b0,this);
  uVar7 = (ulong)uVar3;
  if (*(int *)(lVar2 + 0x280) != 1) {
    uVar10 = (ulong)uVar3;
    uVar7 = uVar4 & 0xffffffff;
  }
  QStyleOption::~QStyleOption((QStyleOption *)&local_b0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return (QSize)(uVar7 | uVar10 << 0x20);
}

Assistant:

QSize QSlider::minimumSizeHint() const
{
    Q_D(const QSlider);
    QSize s = sizeHint();
    QStyleOptionSlider opt;
    initStyleOption(&opt);
    int length = style()->pixelMetric(QStyle::PM_SliderLength, &opt, this);
    if (d->orientation == Qt::Horizontal)
        s.setWidth(length);
    else
        s.setHeight(length);
    return s;
}